

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O3

uint8_t * __thiscall LayoutFile::loadTypes(LayoutFile *this,uint8_t *buf,uint count)

{
  int iVar1;
  int iVar2;
  Widget *pWVar3;
  undefined **ppuVar4;
  undefined4 extraout_var;
  int rootWidget;
  LayoutType local_58;
  
  if (buf == (uint8_t *)0x0) {
    return (uint8_t *)0x0;
  }
  if (count != 0) {
    do {
      LayoutType::LayoutType(&local_58);
      iVar1 = Util::readInt32(buf,&local_58.widgetIndex);
      iVar2 = Util::readString(buf + iVar1,&local_58.name);
      std::vector<LayoutType,_std::allocator<LayoutType>_>::push_back(&this->types,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.name._M_dataplus._M_p != &local_58.name.field_2) {
        operator_delete(local_58.name._M_dataplus._M_p);
      }
      buf = buf + iVar1 + iVar2;
      count = count - 1;
    } while (count != 0);
  }
  iVar1 = Util::readInt32(buf,&local_58.widgetIndex);
  iVar2 = std::__cxx11::string::compare
                    ((char *)&(this->types).
                              super__Vector_base<LayoutType,_std::allocator<LayoutType>_>._M_impl.
                              super__Vector_impl_data._M_start[local_58.widgetIndex].name);
  if (iVar2 == 0) {
    pWVar3 = (Widget *)operator_new(200);
    memset(pWVar3,0,200);
    (pWVar3->name)._M_dataplus._M_p = (pointer)&(pWVar3->name).field_2;
    (pWVar3->name).field_2._M_local_buf[0] = '\0';
    (pWVar3->stylefile)._M_dataplus._M_p = (pointer)&(pWVar3->stylefile).field_2;
    (pWVar3->stylefile).field_2._M_local_buf[0] = '\0';
    pWVar3->_vptr_Widget = (_func_int **)&PTR_writeXml_abi_cxx11__00116ce0;
    pWVar3[1]._vptr_Widget = (_func_int **)&pWVar3[1].children;
    *(undefined1 *)
     &pWVar3[1].children.super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
      super__Vector_impl_data._M_start = 0;
  }
  else {
    iVar2 = std::__cxx11::string::compare
                      ((char *)&(this->types).
                                super__Vector_base<LayoutType,_std::allocator<LayoutType>_>._M_impl.
                                super__Vector_impl_data._M_start[local_58.widgetIndex].name);
    if (iVar2 == 0) {
      pWVar3 = (Widget *)operator_new(0xb8);
      memset(pWVar3,0,0xb8);
      (pWVar3->name)._M_dataplus._M_p = (pointer)&(pWVar3->name).field_2;
      (pWVar3->name).field_2._M_local_buf[0] = '\0';
      (pWVar3->stylefile)._M_dataplus._M_p = (pointer)&(pWVar3->stylefile).field_2;
      (pWVar3->stylefile).field_2._M_local_buf[0] = '\0';
      ppuVar4 = &PTR_writeXml_abi_cxx11__00116ca8;
    }
    else {
      iVar2 = std::__cxx11::string::compare
                        ((char *)&(this->types).
                                  super__Vector_base<LayoutType,_std::allocator<LayoutType>_>.
                                  _M_impl.super__Vector_impl_data._M_start[local_58.widgetIndex].
                                  name);
      if (iVar2 != 0) {
        pWVar3 = this->root;
        if (pWVar3 == (Widget *)0x0) {
          puts("Unsupported root widget\r");
          return buf + iVar1;
        }
        goto LAB_0010da47;
      }
      pWVar3 = (Widget *)operator_new(0xb8);
      memset(pWVar3,0,0xb8);
      (pWVar3->name)._M_dataplus._M_p = (pointer)&(pWVar3->name).field_2;
      (pWVar3->name).field_2._M_local_buf[0] = '\0';
      (pWVar3->stylefile)._M_dataplus._M_p = (pointer)&(pWVar3->stylefile).field_2;
      (pWVar3->stylefile).field_2._M_local_buf[0] = '\0';
      ppuVar4 = &PTR_writeXml_abi_cxx11__00116c38;
    }
    pWVar3->_vptr_Widget = (_func_int **)ppuVar4;
  }
  this->root = pWVar3;
LAB_0010da47:
  iVar1 = (*pWVar3->_vptr_Widget[1])(pWVar3,buf + iVar1);
  pWVar3 = this->root;
  if (0 < pWVar3->numChildren) {
    iVar2 = 0;
    do {
      processWidget(this,(uint8_t *)CONCAT44(extraout_var,iVar1),pWVar3);
      iVar2 = iVar2 + 1;
      pWVar3 = this->root;
    } while (iVar2 < pWVar3->numChildren);
  }
  return (uint8_t *)CONCAT44(extraout_var,iVar1);
}

Assistant:

uint8_t *LayoutFile::loadTypes(uint8_t* buf, unsigned int count)
{
	if (buf == nullptr)
		return buf;

	for (int i = 0; i < count; i++)
	{
		LayoutType layoutType;

		buf += Util::readInt32(buf, layoutType.widgetIndex);
		buf += Util::readString(buf, layoutType.name);

		types.push_back(layoutType);
	}

	int rootWidget;
	buf += Util::readInt32(buf, rootWidget);

	if (types[rootWidget].name == "Scene")
	{
		root = new SceneW();
	}
	else if (types[rootWidget].name == "Panel")
	{
		root = new Panel();
	}
	else if (types[rootWidget].name == "ListPanelItem")
	{
		root = new ListPanelItem();
	}
	if (root == nullptr)
	{
		printf("Unsupported root widget\r\n");
		return buf;
	}

	buf = root->read(buf);

	for (int i = 0; i < root->numChildren; i++)
	{
		processWidget(buf, root);
	}

	return buf;
}